

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O2

void __thiscall
ValidationSignals::ValidationSignals
          (ValidationSignals *this,
          unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
          task_runner)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    std::
    make_unique<ValidationSignalsImpl,std::unique_ptr<util::TaskRunnerInterface,std::default_delete<util::TaskRunnerInterface>>>
              ((unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                *)this);
    return;
  }
  __stack_chk_fail();
}

Assistant:

ValidationSignals::ValidationSignals(std::unique_ptr<util::TaskRunnerInterface> task_runner)
    : m_internals{std::make_unique<ValidationSignalsImpl>(std::move(task_runner))} {}